

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O3

void __thiscall Entity::Entity(Entity *this,Attributes *attrs)

{
  Entity *pEVar1;
  pointer pEVar2;
  undefined1 uVar3;
  uint16_t uVar4;
  undefined4 uVar5;
  uint8_t uVar6;
  Position PVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  size_type sVar17;
  mapped_type *pmVar18;
  size_type sVar19;
  
  uVar6 = attrs->type_id;
  PVar7 = attrs->position;
  uVar8 = attrs->orientation;
  uVar9 = attrs->palette;
  uVar10 = attrs->speed;
  bVar11 = attrs->fightable;
  bVar12 = attrs->liftable;
  bVar13 = attrs->can_pass_through;
  bVar14 = attrs->appear_after_player_moved_away;
  bVar15 = attrs->gravity_immune;
  bVar16 = attrs->talkable;
  uVar3 = attrs->field_0x11;
  uVar4 = attrs->behavior_id;
  uVar5 = *(undefined4 *)&attrs->field_0x14;
  pEVar1 = attrs->entity_to_use_tiles_from;
  (this->_attrs).dialogue = attrs->dialogue;
  (this->_attrs).field_0x11 = uVar3;
  (this->_attrs).behavior_id = uVar4;
  *(undefined4 *)&(this->_attrs).field_0x14 = uVar5;
  (this->_attrs).entity_to_use_tiles_from = pEVar1;
  (this->_attrs).type_id = uVar6;
  (this->_attrs).position = PVar7;
  (this->_attrs).orientation = uVar8;
  (this->_attrs).palette = uVar9;
  (this->_attrs).speed = uVar10;
  (this->_attrs).fightable = bVar11;
  (this->_attrs).liftable = bVar12;
  (this->_attrs).can_pass_through = bVar13;
  (this->_attrs).appear_after_player_moved_away = bVar14;
  (this->_attrs).gravity_immune = bVar15;
  (this->_attrs).talkable = bVar16;
  pEVar2 = (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_attrs).mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->_attrs).mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
  _M_impl.super__Vector_impl_data._M_finish = pEVar2;
  (this->_attrs).mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (attrs->mask_flags).super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_attrs).persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  (this->_attrs).persistence_flag.byte = (attrs->persistence_flag).byte;
  (this->_attrs).persistence_flag.bit = (attrs->persistence_flag).bit;
  bVar11 = attrs->flag_unknown_2_4;
  (this->_attrs).flag_unknown_2_3 = attrs->flag_unknown_2_3;
  (this->_attrs).flag_unknown_2_4 = bVar11;
  (this->_attrs).flag_unknown_3_5 = attrs->flag_unknown_3_5;
  this->_map = (Map *)0x0;
  sVar17 = std::
           map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
           ::count(&DEFAULT_PALETTES,(key_type_conflict *)this);
  if (sVar17 != 0) {
    pmVar18 = std::
              map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
              ::at(&DEFAULT_PALETTES,(key_type_conflict *)this);
    (this->_attrs).palette = *pmVar18;
  }
  sVar19 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                     (&LIFTABLE_TYPES,(key_type_conflict *)this);
  if (sVar19 != 0) {
    (this->_attrs).liftable = true;
  }
  sVar19 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                     (&FIGHTABLE_TYPES,(key_type_conflict *)this);
  if (sVar19 != 0) {
    (this->_attrs).fightable = true;
  }
  sVar19 = std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::count
                     (&ENEMY_TYPES,(key_type_conflict *)this);
  if (sVar19 != 0) {
    (this->_attrs).speed = '\x01';
    (this->_attrs).fightable = true;
    (this->_attrs).behavior_id = 1;
  }
  return;
}

Assistant:

Entity::Entity(Attributes attrs) :
    _attrs  (std::move(attrs)),
    _map    (nullptr)
{
    if(DEFAULT_PALETTES.count(_attrs.type_id))
        _attrs.palette = DEFAULT_PALETTES.at(_attrs.type_id);

    if(LIFTABLE_TYPES.count(_attrs.type_id))
        _attrs.liftable = true;

    if(FIGHTABLE_TYPES.count(_attrs.type_id))
        _attrs.fightable = true;

    if(ENEMY_TYPES.count(_attrs.type_id))
    {
        _attrs.fightable = true;
        _attrs.speed = 1;
        _attrs.behavior_id = 1;
    }
}